

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::NextTransition
          (TimeZoneInfo *this,time_point<seconds> *tp,civil_transition *trans)

{
  pointer pTVar1;
  pointer pTVar2;
  undefined8 uVar3;
  int_least8_t iVar4;
  int_least8_t iVar5;
  int_least8_t iVar6;
  int_least8_t iVar7;
  int_least8_t iVar8;
  undefined3 uVar9;
  pointer pTVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint_least8_t *puVar14;
  pointer pTVar15;
  bool bVar16;
  fields fVar17;
  
  pTVar15 = (this->transitions_).
            super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (this->transitions_).
           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar15 == pTVar1) {
    bVar16 = false;
  }
  else {
    pTVar10 = pTVar15 + 1;
    if (-0x800000000000000 < pTVar15->unix_time) {
      pTVar10 = pTVar15;
    }
    pTVar15 = pTVar10;
    if (0 < (long)pTVar1 - (long)pTVar10) {
      uVar11 = ((ulong)((long)pTVar1 - (long)pTVar10) >> 4) * -0x5555555555555555;
      do {
        uVar12 = uVar11 >> 1;
        uVar13 = uVar12;
        if (pTVar15[uVar12].unix_time <= (tp->__d).__r) {
          uVar13 = ~uVar12 + uVar11;
          pTVar15 = pTVar15 + uVar12 + 1;
        }
        uVar11 = uVar13;
      } while (0 < (long)uVar13);
    }
    if (pTVar15 != pTVar1) {
      pTVar2 = (this->transition_types_).
               super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        puVar14 = &pTVar15[-1].type_index;
        if (pTVar15 == pTVar10) {
          puVar14 = &this->default_transition_type_;
        }
        if (*puVar14 != pTVar15->type_index) {
          uVar11 = (ulong)((uint)*puVar14 * 0x30);
          uVar13 = (ulong)((uint)pTVar15->type_index * 0x30);
          if (*(int *)((long)&pTVar2->utc_offset + uVar11) !=
              *(int *)((long)&pTVar2->utc_offset + uVar13)) break;
          if (((&pTVar2->is_dst)[uVar11] != (&pTVar2->is_dst)[uVar13]) ||
             ((&pTVar2->abbr_index)[uVar11] != (&pTVar2->abbr_index)[uVar13])) break;
        }
        pTVar15 = pTVar15 + 1;
      } while (pTVar15 != pTVar1);
    }
    bVar16 = pTVar15 != pTVar1;
    if (bVar16) {
      uVar3._0_1_ = (pTVar15->prev_civil_sec).f_.m;
      uVar3._1_1_ = (pTVar15->prev_civil_sec).f_.d;
      uVar3._2_1_ = (pTVar15->prev_civil_sec).f_.hh;
      uVar3._3_1_ = (pTVar15->prev_civil_sec).f_.mm;
      uVar3._4_1_ = (pTVar15->prev_civil_sec).f_.ss;
      uVar3._5_3_ = *(undefined3 *)&(pTVar15->prev_civil_sec).f_.field_0xd;
      fVar17 = detail::step((pTVar15->prev_civil_sec).f_.y,uVar3,1);
      uVar11 = fVar17._8_8_ & 0xffffffffff;
      (trans->from).f_.y = fVar17.y;
      (trans->from).f_.m = (char)uVar11;
      (trans->from).f_.d = (char)(uVar11 >> 8);
      (trans->from).f_.hh = (char)(uVar11 >> 0x10);
      (trans->from).f_.mm = (char)(uVar11 >> 0x18);
      (trans->from).f_.ss = (char)(uVar11 >> 0x20);
      *(int3 *)&(trans->from).f_.field_0xd = (int3)(uVar11 >> 0x28);
      iVar4 = (pTVar15->civil_sec).f_.m;
      iVar5 = (pTVar15->civil_sec).f_.d;
      iVar6 = (pTVar15->civil_sec).f_.hh;
      iVar7 = (pTVar15->civil_sec).f_.mm;
      iVar8 = (pTVar15->civil_sec).f_.ss;
      uVar9 = *(undefined3 *)&(pTVar15->civil_sec).f_.field_0xd;
      (trans->to).f_.y = (pTVar15->civil_sec).f_.y;
      (trans->to).f_.m = iVar4;
      (trans->to).f_.d = iVar5;
      (trans->to).f_.hh = iVar6;
      (trans->to).f_.mm = iVar7;
      (trans->to).f_.ss = iVar8;
      *(undefined3 *)&(trans->to).f_.field_0xd = uVar9;
    }
  }
  return bVar16;
}

Assistant:

bool TimeZoneInfo::NextTransition(const time_point<seconds>& tp,
                                  time_zone::civil_transition* trans) const {
  if (transitions_.empty()) return false;
  const Transition* begin = &transitions_[0];
  const Transition* end = begin + transitions_.size();
  if (begin->unix_time <= -(1LL << 59)) {
    // Do not report the BIG_BANG found in some zoneinfo data as it is
    // really a sentinel, not a transition.  See pre-2018f tz/zic.c.
    ++begin;
  }
  std::int_fast64_t unix_time = ToUnixSeconds(tp);
  const Transition target = {unix_time, 0, civil_second(), civil_second()};
  const Transition* tr =
      std::upper_bound(begin, end, target, Transition::ByUnixTime());
  for (; tr != end; ++tr) {  // skip no-op transitions
    std::uint_fast8_t prev_type_index =
        (tr == begin) ? default_transition_type_ : tr[-1].type_index;
    if (!EquivTransitions(prev_type_index, tr[0].type_index)) break;
  }
  // When tr == end we return false, ignoring future_spec_.
  if (tr == end) return false;
  trans->from = tr->prev_civil_sec + 1;
  trans->to = tr->civil_sec;
  return true;
}